

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_mir
          (Inline_Func *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ostream *poVar5;
  pointer ppVar6;
  size_type sVar7;
  EVP_PKEY_CTX *in_RSI;
  Inline_Func *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *in_stack_000001b8;
  MirFunction *in_stack_000001c0;
  string *in_stack_000001c8;
  Inline_Func *in_stack_000001d0;
  iterator iter_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *pair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allInlinedFuncs;
  iterator iter;
  key_type *in_stack_fffffffffffffb78;
  Function *in_stack_fffffffffffffb80;
  key_type *in_stack_fffffffffffffb88;
  Function *in_stack_fffffffffffffb90;
  value_type *in_stack_fffffffffffffb98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffba0;
  Function *in_stack_fffffffffffffba8;
  ostream *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc10;
  _Self in_stack_fffffffffffffc80;
  allocator<char> local_371;
  string local_370 [39];
  undefined1 local_349 [121];
  time_point_sys_clock local_2d0;
  Timestamp local_2c8 [3];
  undefined1 local_279;
  _Self local_278;
  _Self local_270;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [120];
  time_point_sys_clock local_1c0;
  Timestamp local_1b8 [3];
  undefined1 local_169;
  string local_168 [32];
  _Self local_148;
  _Self local_140;
  undefined1 *local_138;
  _Base_ptr local_130;
  undefined1 local_128;
  reference local_120;
  _Self local_118;
  _Self local_110;
  EVP_PKEY_CTX *local_108;
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator<char> local_e9;
  string local_e8 [32];
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [48];
  _Base_ptr local_60;
  string local_48 [32];
  _Self local_28;
  _Self local_20 [2];
  EVP_PKEY_CTX *local_10;
  
  local_10 = in_RSI;
  init(in_RDI,in_RSI);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffffb78);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffffb78);
    bVar1 = std::operator!=(local_20,&local_28);
    if (!bVar1) break;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                           *)0x154b21);
    std::__cxx11::string::string(local_48,(string *)ppVar6);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x154b46);
    optimize_func(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    std::__cxx11::string::~string(local_48);
    local_60 = (_Base_ptr)
               std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
               ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                             *)in_stack_fffffffffffffb88,
                            (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x154bcc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  pVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_c8 = (_Base_ptr)pVar8.first._M_node;
  local_c0 = pVar8.second;
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  pVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_100 = (_Base_ptr)pVar8.first._M_node;
  local_f8 = pVar8.second;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_108 = local_10 + 8;
  local_110._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffffb78);
  local_118._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              *)in_stack_fffffffffffffb78);
  while (bVar1 = std::operator!=(&local_110,&local_118), bVar1) {
    local_120 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                             *)0x154d7f);
    peVar2 = std::
             __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x154d9c);
    if ((((peVar2->is_extern & 1U) == 0) &&
        (sVar3 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88), sVar3 == 0)) &&
       (sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88), sVar3 == 0)) {
      pVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      in_stack_fffffffffffffc10 = pVar8.first._M_node;
      in_stack_fffffffffffffc0f = pVar8.second;
      local_130 = in_stack_fffffffffffffc10._M_node;
      local_128 = in_stack_fffffffffffffc0f;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_fffffffffffffb80);
  }
  local_138 = local_90;
  local_140._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb78);
  local_148._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb78);
  while (bVar1 = std::operator!=(&local_140,&local_148), bVar1) {
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x154f7b);
    std::__cxx11::string::string(local_168,(string *)pbVar4);
    local_169 = 0;
    AixLog::operator<<((ostream *)in_stack_fffffffffffffc80._M_node,(Severity *)in_RDI);
    AixLog::Tag::Tag((Tag *)0x154fc0);
    AixLog::operator<<(in_stack_fffffffffffffbb0,(Tag *)in_stack_fffffffffffffba8);
    local_1c0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_1b8,&local_1c0);
    AixLog::operator<<((ostream *)in_stack_fffffffffffffc10._M_node,
                       (Timestamp *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    AixLog::Function::Function
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               (string *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    poVar5 = AixLog::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    poVar5 = std::operator<<(poVar5,local_168);
    poVar5 = std::operator<<(poVar5," is deleted because all of it\'s calls are inlined ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    AixLog::Timestamp::~Timestamp(local_1b8);
    AixLog::Tag::~Tag((Tag *)0x155157);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
    ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
             *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_168);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb80);
  }
  local_270._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffffb78);
  while( true ) {
    local_278._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffffb78);
    bVar1 = std::operator!=(&local_270,&local_278);
    if (!bVar1) break;
    local_279 = 0;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              AixLog::operator<<((ostream *)in_stack_fffffffffffffc80._M_node,(Severity *)in_RDI);
    AixLog::Tag::Tag((Tag *)0x15531f);
    poVar5 = AixLog::operator<<(in_stack_fffffffffffffbb0,(Tag *)in_stack_fffffffffffffba8);
    local_2d0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_2c8,&local_2d0);
    in_stack_fffffffffffffbb0 =
         AixLog::operator<<((ostream *)in_stack_fffffffffffffc10._M_node,
                            (Timestamp *)
                            CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    in_stack_fffffffffffffba8 = (Function *)local_349;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)poVar5,(allocator<char> *)in_stack_fffffffffffffbb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)poVar5,(allocator<char> *)in_stack_fffffffffffffbb0);
    AixLog::Function::Function
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               (string *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    poVar5 = AixLog::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                           *)0x15541b);
    in_stack_fffffffffffffb90 = (Function *)std::operator<<(poVar5,(string *)&(ppVar6->second).name)
    ;
    in_stack_fffffffffffffb88 =
         (key_type *)std::operator<<((ostream *)in_stack_fffffffffffffb90," variables size is ");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x155458);
    sVar7 = std::
            map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            ::size((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)0x155464);
    in_stack_fffffffffffffb80 =
         (Function *)std::ostream::operator<<(in_stack_fffffffffffffb88,sVar7);
    std::ostream::operator<<(in_stack_fffffffffffffb80,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string((string *)(local_349 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_349);
    AixLog::Timestamp::~Timestamp(local_2c8);
    AixLog::Tag::~Tag((Tag *)0x1554e6);
    in_stack_fffffffffffffc80 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
         ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                       *)in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1555f4);
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    init(package);
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->first, iter->second, package.functions);
    }
    std::set<std::string> allInlinedFuncs;
    uninlined_funcs.insert("main");
    uninlined_funcs.insert("f__main");
    for (auto& pair : package.functions) {
      if (pair.second.type->is_extern) continue;
      if (!uninlined_funcs.count(pair.first) &&
          !uninlineable_funcs.count(pair.first)) {
        allInlinedFuncs.insert(pair.first);
      }
    }
    for (auto s : allInlinedFuncs) {
      LOG(TRACE) << s << " is deleted because all of it's calls are inlined "
                 << std::endl;
      package.functions.erase(s);
    }
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      LOG(TRACE) << iter->second.name << " variables size is "
                 << iter->second.variables.size() << std::endl;
    }
  }